

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O1

void Eso_ManMinimizeAdd(Eso_Man_t *p,int Cube)

{
  int iVar1;
  Hsh_VecMan_t *pHVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int *piVar13;
  Vec_Int_t *pVVar14;
  ulong uVar15;
  int *piVar16;
  uint uVar17;
  uint nLits;
  long lVar18;
  int *piVar19;
  bool bVar20;
  uint local_4c;
  
  local_4c = Cube;
  do {
    uVar5 = p->Cube1;
    if (uVar5 == local_4c) {
      pVVar8 = (Vec_Int_t *)0x0;
    }
    else {
      if ((int)local_4c < 0) {
        __assert_fail("iCube >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                      ,0x30,"Vec_Int_t *Eso_ManCube(Eso_Man_t *, int)");
      }
      pHVar2 = p->pHash;
      if (pHVar2->vMap->nSize <= (int)local_4c) goto LAB_006d2641;
      iVar6 = pHVar2->vMap->pArray[local_4c];
      if (((long)iVar6 < 0) || (pHVar2->vData->nSize <= iVar6)) goto LAB_006d2622;
      piVar19 = pHVar2->vData->pArray + iVar6;
      iVar6 = *piVar19;
      pVVar8 = &pHVar2->vTemp;
      (pHVar2->vTemp).nCap = iVar6;
      (pHVar2->vTemp).nSize = iVar6;
      (pHVar2->vTemp).pArray = piVar19 + 2;
    }
    if (uVar5 == local_4c) {
      piVar19 = (int *)0x0;
    }
    else {
      piVar19 = pVVar8->pArray;
    }
    uVar11 = 0;
    if (uVar5 != local_4c) {
      uVar11 = (ulong)(uint)pVVar8->nSize;
    }
    nLits = (uint)uVar11;
    if ((int)nLits < 0) {
LAB_006d267f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    iVar6 = p->vCubes->nSize;
    if (iVar6 <= (int)nLits) goto LAB_006d267f;
    pVVar14 = p->vCubes->pArray;
    pVVar8 = pVVar14 + uVar11;
    iVar1 = pVVar14[uVar11].nSize;
    uVar9 = 0xffffffff;
    if (0 < (long)iVar1) {
      uVar15 = 0;
      do {
        if (pVVar8->pArray[uVar15] == local_4c) {
          uVar9 = uVar15 & 0xffffffff;
          break;
        }
        uVar15 = uVar15 + 1;
      } while ((long)iVar1 != uVar15);
    }
    iVar7 = (int)uVar9;
    if (-1 < iVar7) {
      if (iVar7 < iVar1) {
        pVVar8->nSize = iVar1 + -1;
        if (iVar1 + -1 <= iVar7) {
          return;
        }
        piVar19 = pVVar8->pArray + uVar9;
        do {
          *piVar19 = piVar19[1];
          uVar5 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar5;
          piVar19 = piVar19 + 1;
        } while ((int)uVar5 < pVVar8->nSize);
        return;
      }
LAB_006d26bd:
      __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x3ff,"void Vec_IntDrop(Vec_Int_t *, int)");
    }
    if (uVar5 == local_4c) {
      if (iVar1 != 0) {
        __assert_fail("Vec_IntSize(vLevel) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                      ,0x10b,"void Eso_ManMinimizeAdd(Eso_Man_t *, int)");
      }
      goto LAB_006d25c4;
    }
    if ((int)nLits < p->nVars + -1) {
      if (iVar6 <= (int)(nLits + 1)) goto LAB_006d267f;
      uVar9 = (ulong)(nLits + 1);
      uVar15 = (ulong)pVVar14[uVar9].nSize;
      bVar20 = 0 < (long)uVar15;
      if (0 < (long)uVar15) {
        piVar3 = pVVar14[uVar9].pArray;
        uVar10 = 0;
LAB_006d21a0:
        uVar5 = piVar3[uVar10];
        if ((ulong)uVar5 == 0xffffffff) {
          piVar13 = (int *)0x0;
        }
        else {
          if ((int)uVar5 < 0) goto LAB_006d2641;
          pVVar4 = p->pHash->vMap;
          if (pVVar4->nSize <= (int)uVar5) goto LAB_006d2641;
          iVar6 = pVVar4->pArray[uVar5];
          if (((long)iVar6 < 0) || (pVVar4 = p->pHash->vData, pVVar4->nSize <= iVar6))
          goto LAB_006d2622;
          piVar13 = pVVar4->pArray + iVar6;
        }
        if (nLits == 0) {
          uVar5 = 0xffffffff;
        }
        else {
          piVar16 = piVar13 + 2;
          uVar17 = 0;
          uVar5 = 0xffffffff;
          do {
            uVar12 = uVar17;
            if (piVar19[(int)uVar17] != *piVar16) {
              if (uVar5 != 0xffffffff) {
                uVar5 = 0xffffffff;
                goto LAB_006d2247;
              }
              uVar12 = uVar17 - 1;
              uVar5 = uVar17;
            }
            uVar17 = uVar12 + 1;
            piVar16 = piVar16 + 1;
          } while ((int)uVar17 < (int)nLits);
        }
        if (uVar5 == 0xffffffff) {
          uVar5 = nLits;
        }
LAB_006d2247:
        if (uVar5 == 0xffffffff) break;
        iVar6 = pVVar14[uVar9].nSize + -1;
        pVVar14[uVar9].nSize = iVar6;
        if ((int)uVar10 < iVar6) {
          do {
            piVar3[uVar10] = piVar3[uVar10 + 1];
            uVar10 = uVar10 + 1;
          } while ((int)uVar10 < pVVar14[uVar9].nSize);
        }
        p->vCube->nSize = 0;
        uVar15 = 0;
        do {
          if (piVar13[uVar15 + 2] < 0) goto LAB_006d2660;
          Vec_IntPush(p->vCube,piVar13[uVar15 + 2] ^ (uint)(uVar5 == uVar15));
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
        local_4c = Hsh_VecManAdd(p->pHash,p->vCube);
        Eso_ManMinimizeAdd(p,local_4c);
      }
LAB_006d22e6:
      if (bVar20) {
        return;
      }
    }
    if (pVVar8->nSize < 1) {
LAB_006d2402:
      if (nLits == 0) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEsop.c"
                      ,0x13e,"void Eso_ManMinimizeAdd(Eso_Man_t *, int)");
      }
      if (p->vCubes->nSize < (int)nLits) goto LAB_006d267f;
      uVar5 = nLits - 1;
      pVVar14 = p->vCubes->pArray + uVar5;
      if ((nLits == 1) && (pVVar14->nSize == 1)) {
        Vec_IntDrop(pVVar14,0);
        if ((int)local_4c < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf4,"int Abc_LitNot(int)");
        }
        local_4c = local_4c ^ 1;
        bVar20 = true;
        goto LAB_006d25b9;
      }
      iVar6 = pVVar14->nSize;
      bVar20 = true;
      if ((long)iVar6 < 1) goto LAB_006d25b9;
      piVar3 = pVVar14->pArray;
      lVar18 = 0;
      goto LAB_006d2475;
    }
    lVar18 = 0;
    while( true ) {
      iVar6 = pVVar8->pArray[lVar18];
      if ((long)iVar6 < 0) goto LAB_006d2641;
      pVVar14 = p->pHash->vMap;
      if (pVVar14->nSize <= iVar6) goto LAB_006d2641;
      iVar6 = pVVar14->pArray[iVar6];
      if (((long)iVar6 < 0) || (pVVar14 = p->pHash->vData, pVVar14->nSize <= iVar6))
      goto LAB_006d2622;
      uVar5 = Eso_ManFindDistOneLitEqual(pVVar14->pArray + (long)iVar6 + 2,piVar19,nLits);
      if (uVar5 != 0xffffffff) break;
      lVar18 = lVar18 + 1;
      if (pVVar8->nSize <= lVar18) goto LAB_006d2402;
    }
    if (pVVar8->nSize <= (int)lVar18) goto LAB_006d26bd;
    iVar6 = pVVar8->nSize + -1;
    pVVar8->nSize = iVar6;
    if ((int)lVar18 < iVar6) {
      piVar3 = pVVar8->pArray;
      do {
        piVar3[lVar18] = piVar3[lVar18 + 1];
        lVar18 = lVar18 + 1;
      } while ((int)lVar18 < pVVar8->nSize);
    }
    p->vCube->nSize = 0;
    if (nLits != 0) {
      if ((int)nLits < 2) {
        uVar11 = 1;
      }
      uVar9 = 0;
      do {
        if (uVar5 != uVar9) {
          Vec_IntPush(p->vCube,piVar19[uVar9]);
        }
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    if (p->vCube->nSize == 0) {
      local_4c = p->Cube1;
    }
    else {
      local_4c = Hsh_VecManAdd(p->pHash,p->vCube);
    }
  } while( true );
  uVar10 = uVar10 + 1;
  bVar20 = uVar10 < uVar15;
  if (uVar10 == uVar15) goto LAB_006d22e6;
  goto LAB_006d21a0;
LAB_006d2475:
  uVar17 = piVar3[lVar18];
  if ((ulong)uVar17 == 0xffffffff) {
    piVar13 = (int *)0x0;
  }
  else {
    if ((int)uVar17 < 0) {
LAB_006d2641:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pVVar4 = p->pHash->vMap;
    if (pVVar4->nSize <= (int)uVar17) goto LAB_006d2641;
    iVar1 = pVVar4->pArray[uVar17];
    if (((long)iVar1 < 0) || (pVVar4 = p->pHash->vData, pVVar4->nSize <= iVar1)) {
LAB_006d2622:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar13 = pVVar4->pArray + iVar1;
  }
  uVar17 = 0xffffffff;
  if (1 < (int)nLits) {
    uVar12 = 0;
    piVar16 = piVar19;
    uVar17 = 0xffffffff;
    do {
      if (piVar13[(long)(int)uVar12 + 2] != *piVar16) {
        if (uVar17 != 0xffffffff) {
          uVar17 = 0xffffffff;
          goto LAB_006d250b;
        }
        uVar17 = uVar12;
        uVar12 = uVar12 - 1;
      }
      uVar12 = uVar12 + 1;
      piVar16 = piVar16 + 1;
    } while ((int)uVar12 < (int)uVar5);
  }
  if (uVar17 == 0xffffffff) {
    uVar17 = uVar5;
  }
LAB_006d250b:
  if (uVar17 != 0xffffffff) {
    pVVar14->nSize = iVar6 + -1;
    if ((int)lVar18 < iVar6 + -1) {
      do {
        piVar3[lVar18] = piVar3[lVar18 + 1];
        lVar18 = lVar18 + 1;
      } while ((int)lVar18 < pVVar14->nSize);
    }
    p->vCube->nSize = 0;
    uVar9 = 1;
    if (1 < (int)nLits) {
      uVar9 = uVar11;
    }
    uVar11 = 0;
    do {
      if (piVar19[uVar11] < 0) {
LAB_006d2660:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      Vec_IntPush(p->vCube,piVar19[uVar11] ^ (uint)(uVar17 == uVar11));
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
    local_4c = Hsh_VecManAdd(p->pHash,p->vCube);
    Eso_ManMinimizeAdd(p,local_4c);
    bVar20 = false;
LAB_006d25b9:
    if (!bVar20) {
      return;
    }
LAB_006d25c4:
    Vec_IntPush(pVVar8,local_4c);
    return;
  }
  lVar18 = lVar18 + 1;
  if (lVar18 == iVar6) goto LAB_006d25b9;
  goto LAB_006d2475;
}

Assistant:

void Eso_ManMinimizeAdd( Eso_Man_t * p, int Cube )
{
    int fMimimize = 1;
    Vec_Int_t * vCube      = (Cube == p->Cube1) ? NULL : Eso_ManCube(p, Cube); 
    int * pCube2, * pCube  = (Cube == p->Cube1) ? NULL : Vec_IntArray(vCube); 
    int Cube2, nLits       = (Cube == p->Cube1) ? 0 : Vec_IntSize(vCube);
    Vec_Int_t * vLevel     = Vec_WecEntry( p->vCubes, nLits );
    int c, k, iLit, iPlace = Vec_IntFind( vLevel, Cube );
    if ( iPlace >= 0 ) // identical found
    {
        Vec_IntDrop( vLevel, iPlace );
        return;
    }
    if ( Cube == p->Cube1 ) // simple case
    {
        assert( Vec_IntSize(vLevel) == 0 );
        Vec_IntPush( vLevel, Cube );
        return;
    }
    // look for distance-1 in next bin
    if ( fMimimize && nLits < p->nVars - 1 )
    {
        Vec_Int_t * vLevel = Vec_WecEntry( p->vCubes, nLits+1 );
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitNotEqual( pCube, pCube2, nLits );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k <= nLits; k++ )
                Vec_IntPush( p->vCube, Abc_LitNotCond(pCube2[k], k == iLit) );
            Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    // look for distance-1 in the same bin
    if ( fMimimize )
    {
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitEqual( pCube2, pCube, nLits );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k < nLits; k++ )
                if ( k != iLit )
                    Vec_IntPush( p->vCube, pCube[k] );
            if ( Vec_IntSize(p->vCube) == 0 )
                Cube = p->Cube1;
            else
                Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    assert( nLits > 0 );
    if ( fMimimize && nLits > 0 )
    {
        // look for distance-1 in the previous bin
        Vec_Int_t * vLevel = Vec_WecEntry( p->vCubes, nLits-1 );
        // check for the case of one-literal cube
        if ( nLits == 1 && Vec_IntSize(vLevel) == 1 )
        {
            Vec_IntDrop( vLevel, 0 );
            Cube = Abc_LitNot( Cube );
        }
        else
        Vec_IntForEachEntry( vLevel, Cube2, c )
        {
            pCube2 = Hsh_VecReadArray( p->pHash, Cube2 ); 
            iLit = Eso_ManFindDistOneLitNotEqual( pCube2, pCube, nLits-1 );
            if ( iLit == -1 )
                continue;
            // remove this cube
            Vec_IntDrop( vLevel, c );
            // create new cube
            Vec_IntClear( p->vCube );
            for ( k = 0; k < nLits; k++ )
                Vec_IntPush( p->vCube, Abc_LitNotCond(pCube[k], k == iLit) );
            Cube = Hsh_VecManAdd( p->pHash, p->vCube );
            // try to add new cube
            Eso_ManMinimizeAdd( p, Cube );
            return;
        }
    }
    // could not find - simply add this cube
    Vec_IntPush( vLevel, Cube );
}